

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O1

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>
               *this,int i)

{
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar1;
  Fad<double> *pFVar2;
  Fad<double> *pFVar3;
  FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *pFVar4;
  Fad<double> *pFVar5;
  Fad<double> *pFVar6;
  
  pFVar1 = (this->left_->fadexpr_).left_;
  pFVar2 = (this->left_->fadexpr_).right_;
  pFVar3 = (pFVar1->fadexpr_).right_;
  pFVar4 = (this->right_->fadexpr_).left_;
  pFVar5 = (this->right_->fadexpr_).right_;
  pFVar6 = (pFVar4->fadexpr_).right_;
  return ((double)(pFVar1->fadexpr_).left_.constant_ + pFVar3->val_ + pFVar2->val_) *
         ((pFVar6->dx_).ptr_to_data[i] + (pFVar5->dx_).ptr_to_data[i]) +
         ((double)(pFVar4->fadexpr_).left_.constant_ + pFVar6->val_ + pFVar5->val_) *
         ((pFVar3->dx_).ptr_to_data[i] + (pFVar2->dx_).ptr_to_data[i]);
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}